

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_rfc5444_writer_mandatory.c
# Opt level: O3

int main(int argc,char **argv)

{
  undefined1 auVar1 [16];
  int iVar2;
  uint uVar3;
  long lVar4;
  undefined8 uVar5;
  uint8_t uVar6;
  uint8_t uVar7;
  uint8_t uVar8;
  uint8_t uVar9;
  uint8_t uVar10;
  uint8_t uVar11;
  uint8_t uVar12;
  uint8_t uVar13;
  uint8_t uVar14;
  uint8_t uVar15;
  uint8_t uVar16;
  uint8_t uVar17;
  uint8_t uVar18;
  uint8_t uVar19;
  uint8_t uVar20;
  uint8_t uVar21;
  
  abuf_init(&dumpbuf);
  auVar1 = _DAT_00102020;
  uVar6 = '\0';
  uVar7 = '\x01';
  uVar8 = '\x02';
  uVar9 = '\x03';
  uVar10 = '\x04';
  uVar11 = '\x05';
  uVar12 = '\x06';
  uVar13 = '\a';
  uVar14 = '\b';
  uVar15 = '\t';
  uVar16 = '\n';
  uVar17 = '\v';
  uVar18 = '\f';
  uVar19 = '\r';
  uVar20 = '\x0e';
  uVar21 = '\x0f';
  lVar4 = 0;
  do {
    tlv_value_buffer[lVar4] = uVar6;
    tlv_value_buffer[lVar4 + 1] = uVar7;
    tlv_value_buffer[lVar4 + 2] = uVar8;
    tlv_value_buffer[lVar4 + 3] = uVar9;
    tlv_value_buffer[lVar4 + 4] = uVar10;
    tlv_value_buffer[lVar4 + 5] = uVar11;
    tlv_value_buffer[lVar4 + 6] = uVar12;
    tlv_value_buffer[lVar4 + 7] = uVar13;
    tlv_value_buffer[lVar4 + 8] = uVar14;
    tlv_value_buffer[lVar4 + 9] = uVar15;
    tlv_value_buffer[lVar4 + 10] = uVar16;
    tlv_value_buffer[lVar4 + 0xb] = uVar17;
    tlv_value_buffer[lVar4 + 0xc] = uVar18;
    tlv_value_buffer[lVar4 + 0xd] = uVar19;
    tlv_value_buffer[lVar4 + 0xe] = uVar20;
    tlv_value_buffer[lVar4 + 0xf] = uVar21;
    lVar4 = lVar4 + 0x10;
    uVar6 = uVar6 + auVar1[0];
    uVar7 = uVar7 + auVar1[1];
    uVar8 = uVar8 + auVar1[2];
    uVar9 = uVar9 + auVar1[3];
    uVar10 = uVar10 + auVar1[4];
    uVar11 = uVar11 + auVar1[5];
    uVar12 = uVar12 + auVar1[6];
    uVar13 = uVar13 + auVar1[7];
    uVar14 = uVar14 + auVar1[8];
    uVar15 = uVar15 + auVar1[9];
    uVar16 = uVar16 + auVar1[10];
    uVar17 = uVar17 + auVar1[0xb];
    uVar18 = uVar18 + auVar1[0xc];
    uVar19 = uVar19 + auVar1[0xd];
    uVar20 = uVar20 + auVar1[0xe];
    uVar21 = uVar21 + auVar1[0xf];
  } while (lVar4 != 0x100);
  rfc5444_writer_init(&writer);
  rfc5444_writer_register_target(&writer,&small_if);
  rfc5444_writer_register_target(&writer,&large_if);
  lVar4 = rfc5444_writer_register_message(&writer,1,0);
  *(code **)(lVar4 + 0xd8) = addMessageHeader;
  *(code **)(lVar4 + 0xe0) = finishMessageHeader;
  rfc5444_writer_register_msgcontentprovider(&writer,&cpr,addrtlvs,1);
  BEGIN_TESTING(clear_elements);
  cunit_start_test("test_frag_80_1");
  tlvcount = 1;
  tlv_value = tlv_value_buffer;
  tlv_value_size = 0x50;
  iVar2 = rfc5444_writer_create_message(&writer,1,4,rfc5444_writer_alltargets_selector,0);
  cunit_named_check(iVar2 == 0,"test_frag_80_1",0xac,"Parser should return 0");
  rfc5444_writer_flush(&writer,&small_if,0);
  rfc5444_writer_flush(&writer,&large_if,0);
  cunit_named_check(fragments == 1,"test_frag_80_1",0xb0,"bad number of fragments: %d\n");
  cunit_named_check(packets_0 == 1,"test_frag_80_1",0xb1,"bad number of packets on if 1: %d\n");
  cunit_named_check(packets_1 == 1,"test_frag_80_1",0xb2,"bad number of packets on if 2: %d\n");
  cunit_end_test("test_frag_80_1");
  cunit_start_test("test_frag_80_2");
  tlvcount = 2;
  tlv_value = tlv_value_buffer;
  tlv_value_size = 0x50;
  uVar3 = rfc5444_writer_create_message(&writer,1,4,rfc5444_writer_alltargets_selector,0);
  uVar5 = rfc5444_strerror(uVar3);
  cunit_named_check(uVar3 == 0xfffffff4,"test_frag_80_2",0xc1,
                    "Parser should return RFC5444_MTU_TOO_SMALL: %s (%d)",uVar5,(ulong)uVar3);
  cunit_named_check(fragments == 0,"test_frag_80_2",0xc3,"bad number of fragments: %d\n");
  cunit_named_check(packets_0 == 0,"test_frag_80_2",0xc4,"bad number of packets on if 1: %d\n");
  cunit_named_check(packets_1 == 0,"test_frag_80_2",0xc5,"bad number of packets on if 2: %d\n");
  cunit_end_test("test_frag_80_2");
  cunit_start_test("test_frag_50_3");
  tlvcount = 3;
  tlv_value = tlv_value_buffer;
  tlv_value_size = 0x32;
  iVar2 = rfc5444_writer_create_message(&writer,1,4,rfc5444_writer_alltargets_selector,0);
  cunit_named_check(iVar2 == 0,"test_frag_50_3",0xd3,"Parser should return 0");
  rfc5444_writer_flush(&writer,&small_if,0);
  rfc5444_writer_flush(&writer,&large_if,0);
  cunit_named_check(fragments == 2,"test_frag_50_3",0xd7,"bad number of fragments: %d\n");
  cunit_named_check(packets_0 == 2,"test_frag_50_3",0xd8,"bad number of packets on if 1: %d\n");
  cunit_named_check(packets_1 == 1,"test_frag_50_3",0xd9,"bad number of packets on if 2: %d\n");
  cunit_end_test("test_frag_50_3");
  rfc5444_writer_cleanup(&writer);
  abuf_free(&dumpbuf);
  iVar2 = FINISH_TESTING();
  return iVar2;
}

Assistant:

int main(int argc __attribute__ ((unused)), char **argv __attribute__ ((unused))) {
  struct rfc5444_writer_message *msg;
  size_t i;

  abuf_init(&dumpbuf);

  for (i=0; i<sizeof(tlv_value_buffer); i++) {
    tlv_value_buffer[i] = i;
  }

  rfc5444_writer_init(&writer);

  rfc5444_writer_register_target(&writer, &small_if);
  rfc5444_writer_register_target(&writer, &large_if);

  msg = rfc5444_writer_register_message(&writer, MSG_TYPE, false);
  msg->addMessageHeader = addMessageHeader;
  msg->finishMessageHeader = finishMessageHeader;

  rfc5444_writer_register_msgcontentprovider(&writer, &cpr, addrtlvs, ARRAYSIZE(addrtlvs));

  BEGIN_TESTING(clear_elements);

  test_frag_80_1();
  test_frag_80_2();
  test_frag_50_3();

  rfc5444_writer_cleanup(&writer);

  abuf_free(&dumpbuf);
  return FINISH_TESTING();
}